

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O0

void __thiscall
adios2::format::BP3Deserializer::ParseMinifooter(BP3Deserializer *this,BufferSTL *bufferSTL)

{
  bool bVar1;
  _Alloc_hider _Var2;
  uchar uVar3;
  const_reference pvVar4;
  unsigned_long uVar5;
  long in_RSI;
  string *in_RDI;
  int8_t fileType;
  string err;
  uint8_t endianness;
  size_t position;
  size_t bufferSize;
  vector<char,_std::allocator<char>_> *buffer;
  size_t *in_stack_fffffffffffffd08;
  size_type *position_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  allocator *in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd50;
  allocator *paVar6;
  int commRank;
  string *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd60;
  string *in_stack_fffffffffffffd70;
  string local_270 [32];
  string local_250 [39];
  undefined1 local_229 [40];
  undefined1 local_201 [40];
  allocator local_1d9;
  string local_1d8 [38];
  char local_1b2;
  allocator local_1b1;
  string local_1b0 [39];
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [39];
  undefined1 local_c1 [49];
  string local_90;
  string local_70 [32];
  string local_50 [39];
  byte local_29;
  size_type local_28;
  size_type local_20;
  vector<char,_std::allocator<char>_> *local_18;
  
  commRank = (int)((ulong)in_stack_fffffffffffffd50 >> 0x20);
  local_18 = (vector<char,_std::allocator<char>_> *)(in_RSI + 0x40);
  local_20 = std::vector<char,_std::allocator<char>_>::size(local_18);
  local_28 = local_20 - 4;
  local_29 = helper::ReadValue<unsigned_char>
                       ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd10,
                        in_stack_fffffffffffffd08,false);
  if (1 < local_29) {
    in_stack_fffffffffffffd60 = &local_90;
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    in_stack_fffffffffffffd58 = (string *)local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_c1 + 1),"Toolkit",(allocator *)in_stack_fffffffffffffd58);
    paVar6 = &local_e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"format::bp::BP3Deserializer",paVar6);
    commRank = (int)((ulong)paVar6 >> 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"ParseMinifooter",&local_111);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffd70,in_RDI,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               commRank);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    std::__cxx11::string::~string((string *)(local_c1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_c1);
    std::__cxx11::string::~string(local_50);
  }
  *(byte *)&in_RDI[2]._M_string_length = -(local_29 == 0) & 1;
  bVar1 = helper::IsLittleEndian();
  if (bVar1 != (bool)((byte)in_RDI[2]._M_string_length & 1)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"Toolkit",&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"format::bp::BP3Deserializer",&local_161);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_188,"ParseMinifooter",&local_189);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1b0,
               "reader found BigEndian bp file, this version of ADIOS2 wasn\'t compiled with the cmake flag -DADIOS2_USE_Endian_Reverse=ON explicitly, in call to Open"
               ,&local_1b1);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffd70,in_RDI,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               commRank);
    std::__cxx11::string::~string(local_1b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
    std::__cxx11::string::~string(local_188);
    std::allocator<char>::~allocator((allocator<char> *)&local_189);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  local_28 = local_28 + 1;
  local_1b2 = helper::ReadValue<signed_char>
                        ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd10,
                         in_stack_fffffffffffffd08,false);
  if (local_1b2 == '\x03') {
    *(undefined1 *)((long)&in_RDI[2]._M_string_length + 1) = 1;
  }
  else if ((local_1b2 == '\0') || (local_1b2 == '\x02')) {
    *(undefined1 *)((long)&in_RDI[2]._M_string_length + 1) = 0;
  }
  _Var2 = (_Alloc_hider)
          helper::ReadValue<unsigned_char>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd10,
                     in_stack_fffffffffffffd08,false);
  in_RDI[2]._M_dataplus = _Var2;
  if ((char)in_RDI[2]._M_dataplus < '\x03') {
    in_stack_fffffffffffffd20 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d8,"Toolkit",in_stack_fffffffffffffd20);
    in_stack_fffffffffffffd18 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_201;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_201 + 1),"format::bp::BP3Deserializer",
               (allocator *)in_stack_fffffffffffffd18);
    in_stack_fffffffffffffd10 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_229;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_229 + 1),"ParseMinifooter",(allocator *)in_stack_fffffffffffffd10);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffd58 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
    std::operator+(in_stack_fffffffffffffd18,(char *)in_stack_fffffffffffffd10);
    helper::Throw<std::runtime_error>
              (in_stack_fffffffffffffd70,in_RDI,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
               commRank);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd70);
    std::__cxx11::string::~string((string *)(local_229 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_229);
    std::__cxx11::string::~string((string *)(local_201 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  }
  local_28 = local_20 -
             *(uint *)((long)&in_RDI[0xc].field_2 + *(long *)(*(long *)in_RDI + -0x18) + 8);
  position_00 = &in_RDI->_M_string_length;
  pvVar4 = std::vector<char,_std::allocator<char>_>::operator[](local_18,local_28);
  std::__cxx11::string::assign((char *)position_00,(ulong)pvVar4);
  local_28 = local_28 + 0x18;
  uVar3 = helper::ReadValue<unsigned_char>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd10,position_00,
                     false);
  in_RDI[2].field_0x1 = uVar3 + 0xd0;
  uVar3 = helper::ReadValue<unsigned_char>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd10,position_00,
                     false);
  in_RDI[2].field_0x2 = uVar3 + 0xd0;
  uVar3 = helper::ReadValue<unsigned_char>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd10,position_00,
                     false);
  in_RDI[2].field_0x3 = uVar3 + 0xd0;
  *(uint *)&in_RDI[2].field_0x4 =
       (uint)(byte)in_RDI[2].field_0x1 * 1000000 + (uint)(byte)in_RDI[2].field_0x2 * 1000 +
       (uint)(byte)in_RDI[2].field_0x3;
  local_28 = local_28 + 1;
  bVar1 = SUB81((ulong)in_stack_fffffffffffffd10 >> 0x38,0);
  uVar5 = helper::ReadValue<unsigned_long>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd20,
                     (size_t *)in_stack_fffffffffffffd18,bVar1);
  in_RDI[1]._M_string_length = uVar5;
  uVar5 = helper::ReadValue<unsigned_long>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd20,
                     (size_t *)in_stack_fffffffffffffd18,bVar1);
  in_RDI[1].field_2._M_allocated_capacity = uVar5;
  uVar5 = helper::ReadValue<unsigned_long>
                    ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffd20,
                     (size_t *)in_stack_fffffffffffffd18,bVar1);
  *(unsigned_long *)((long)&in_RDI[1].field_2 + 8) = uVar5;
  return;
}

Assistant:

void BP3Deserializer::ParseMinifooter(const BufferSTL &bufferSTL)
{
    const auto &buffer = bufferSTL.m_Buffer;
    const size_t bufferSize = buffer.size();
    size_t position = bufferSize - 4;
    const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
    if (endianness > 1)
    {
        std::string err = "The endianness flag in the .bp file was neither zero nor one (" +
                          std::to_string(endianness) +
                          "), this indicates the the file is either corrupted, or not a .bp "
                          "file.";
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter", err);
    }
    m_Minifooter.IsLittleEndian = (endianness == 0) ? true : false;
#ifndef ADIOS2_HAVE_ENDIAN_REVERSE
    if (helper::IsLittleEndian() != m_Minifooter.IsLittleEndian)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter",
                                          "reader found BigEndian bp file, "
                                          "this version of ADIOS2 wasn't compiled "
                                          "with the cmake flag -DADIOS2_USE_Endian_Reverse=ON "
                                          "explicitly, in call to Open");
    }
#endif

    position += 1;

    const int8_t fileType =
        helper::ReadValue<int8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    if (fileType == 3)
    {
        m_Minifooter.HasSubFiles = true;
    }
    else if (fileType == 0 || fileType == 2)
    {
        m_Minifooter.HasSubFiles = false;
    }

    m_Minifooter.Version =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian);
    if (m_Minifooter.Version < 3)
    {
        helper::Throw<std::runtime_error>("Toolkit", "format::bp::BP3Deserializer",
                                          "ParseMinifooter",
                                          "ADIOS2 only supports bp format "
                                          "version 3 and above, found " +
                                              std::to_string(m_Minifooter.Version) + " version");
    }

    position = bufferSize - m_MetadataSet.MiniFooterSize;

    // Writer's ADIOS version
    m_Minifooter.VersionTag.assign(&buffer[position], 28);
    position += 24;
    m_Minifooter.ADIOSVersionMajor =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersionMinor =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersionPatch =
        helper::ReadValue<uint8_t>(buffer, position, m_Minifooter.IsLittleEndian) - (uint8_t)'0';
    m_Minifooter.ADIOSVersion = m_Minifooter.ADIOSVersionMajor * 1000000 +
                                m_Minifooter.ADIOSVersionMinor * 1000 +
                                m_Minifooter.ADIOSVersionPatch;
    ++position;
    ;

    m_Minifooter.PGIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_Minifooter.VarsIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    m_Minifooter.AttributesIndexStart =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
}